

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_playback(Pager *pPager,int isHot)

{
  i64 *pOffset;
  sqlite3_vfs *psVar1;
  char *pcVar2;
  ulong uVar3;
  sqlite3_io_methods *psVar4;
  u64 n;
  u32 uVar5;
  u32 uVar6;
  sqlite3_file *pJrnl;
  int iVar7;
  int iVar8;
  sqlite3_file *__s;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  sqlite3_vfs *pVfs;
  uint uVar13;
  char *pcVar14;
  bool bVar15;
  int res;
  u32 nRec;
  i64 nMasterJournal;
  Pgno mxPg;
  i64 szJ;
  u32 savedPageSize;
  int local_88;
  int local_78;
  u32 local_74;
  char *local_70;
  char *local_68;
  ulong local_60;
  int local_58;
  u32 local_54;
  ulong local_50;
  sqlite3_file *local_48;
  u32 local_40;
  int local_3c;
  long local_38;
  
  psVar1 = pPager->pVfs;
  local_54 = 0;
  local_78 = 1;
  local_40 = pPager->pageSize;
  iVar7 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&local_50);
  uVar13 = 0;
  if (iVar7 == 0) {
    pcVar2 = pPager->pTmpSpace;
    iVar7 = readMasterJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
    if (iVar7 == 0) {
      uVar13 = 0;
      iVar7 = 0;
      if (*pcVar2 != '\0') {
        iVar7 = (*psVar1->xAccess)(psVar1,pcVar2,0,&local_78);
      }
      if ((iVar7 == 0) && (local_78 != 0)) {
        pOffset = &pPager->journalOff;
        pPager->journalOff = 0;
        local_88 = isHot;
        uVar13 = 0;
LAB_001384ae:
        iVar7 = readJournalHdr(pPager,isHot,local_50,&local_74,&local_54);
        uVar6 = local_54;
        if (iVar7 == 0) {
          uVar11 = (ulong)pPager->sectorSize;
          if (local_74 == 0xffffffff) {
            local_74 = (u32)((long)(local_50 - uVar11) / ((long)pPager->pageSize + 8));
          }
          uVar3 = *pOffset;
          if ((local_74 == 0 && isHot == 0) && (pPager->journalHdr + uVar11 == uVar3)) {
            local_74 = (u32)((long)(local_50 - uVar3) / ((long)pPager->pageSize + 8));
          }
          uVar5 = local_74;
          if (uVar3 == uVar11) {
            iVar7 = pager_truncate(pPager,local_54);
            if (iVar7 != 0) goto LAB_00138418;
            pPager->dbSize = uVar6;
          }
          if (uVar5 != 0) {
            bVar15 = local_88 == 0;
            iVar12 = 0;
            do {
              if (!bVar15) {
                pager_reset(pPager);
              }
              iVar7 = pager_playback_one_page(pPager,pOffset,(Bitvec *)0x0,1,0);
              if (iVar7 != 0) {
                if (iVar7 != 0x65) {
                  uVar13 = uVar13 - iVar12;
                  if (iVar7 != 0x20a) goto LAB_00138604;
                  goto LAB_0013860d;
                }
                *pOffset = local_50;
                uVar13 = uVar13 - iVar12;
                local_88 = 0;
                goto LAB_001384ae;
              }
              iVar12 = iVar12 + -1;
              bVar15 = true;
            } while (-uVar5 != iVar12);
            local_88 = 0;
            uVar13 = uVar13 + uVar5;
          }
          goto LAB_001384ae;
        }
        if (iVar7 == 0x65) goto LAB_0013860d;
      }
      else {
LAB_00138604:
        if (iVar7 == 0) {
LAB_0013860d:
          iVar7 = sqlite3PagerSetPagesize(pPager,&local_40,-1);
          pPager->changeCountDone = pPager->tempFile;
          if (iVar7 != 0) goto LAB_0013841e;
          pcVar2 = pPager->pTmpSpace;
          iVar7 = readMasterJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
          if ((iVar7 != 0) ||
             (((byte)(pPager->eState - 4) < 0xfd &&
              (iVar7 = sqlite3PagerSync(pPager,(char *)0x0), iVar7 != 0)))) goto LAB_0013841e;
          iVar7 = pager_end_transaction(pPager,(uint)(*pcVar2 != '\0'),0);
          if ((iVar7 != 0) || ((iVar7 = 0, *pcVar2 == '\0' || (local_78 == 0)))) goto LAB_0013841e;
          psVar1 = pPager->pVfs;
          n = (long)psVar1->szOsFile * 2;
          __s = (sqlite3_file *)sqlite3Malloc(n);
          if (__s == (sqlite3_file *)0x0) {
            iVar7 = 7;
            goto LAB_0013841e;
          }
          memset(__s,0,n);
          local_68 = (char *)(long)psVar1->szOsFile;
          iVar7 = (*psVar1->xOpen)(psVar1,pcVar2,__s,0x4001,(int *)0x0);
          pcVar14 = local_68;
          if ((iVar7 == 0) &&
             (iVar7 = (*__s->pMethods->xFileSize)(__s,(sqlite3_int64 *)&local_60), iVar7 == 0)) {
            local_38 = (long)psVar1->mxPathname;
            pcVar9 = (char *)sqlite3Malloc(local_60 + local_38 + 2);
            uVar11 = local_60;
            if (pcVar9 == (char *)0x0) {
              iVar7 = 7;
              goto LAB_00138737;
            }
            local_70 = pcVar9;
            iVar7 = (*__s->pMethods->xRead)(__s,pcVar9,(int)local_60,0);
            pcVar9 = local_70;
            if (iVar7 == 0) {
              local_70[local_60] = '\0';
              if (0 < (long)local_60) {
                local_48 = (sqlite3_file *)(pcVar14 + (long)&__s->pMethods);
                local_38 = local_38 + 1;
                local_68 = local_70 + uVar11 + 1;
                pcVar14 = local_70;
                do {
                  iVar12 = (*psVar1->xAccess)(psVar1,pcVar14,0,&local_3c);
                  pJrnl = local_48;
                  iVar7 = iVar12;
                  if (iVar12 != 0) {
LAB_00138922:
                    sqlite3_free(local_70);
                    goto LAB_00138742;
                  }
                  if (local_3c != 0) {
                    iVar7 = (*psVar1->xOpen)(psVar1,pcVar14,local_48,0x801,(int *)0x0);
                    if (iVar7 == 0) {
                      local_58 = readMasterJournal(pJrnl,local_68,(u32)local_38);
                      psVar4 = pJrnl->pMethods;
                      if (psVar4 != (sqlite3_io_methods *)0x0) {
                        (*psVar4->xClose)(local_48);
                        local_48->pMethods = (sqlite3_io_methods *)0x0;
                      }
                      iVar7 = local_58;
                      if ((local_58 == 0) &&
                         ((*local_68 == '\0' ||
                          (iVar8 = strcmp(local_68,pcVar2), iVar7 = iVar12, iVar8 != 0))))
                      goto LAB_001388a9;
                    }
                    goto LAB_00138922;
                  }
LAB_001388a9:
                  sVar10 = strlen(pcVar14);
                  pcVar14 = pcVar14 + (ulong)((uint)sVar10 & 0x3fffffff) + 1;
                } while ((long)pcVar14 - (long)local_70 < (long)local_60);
              }
              if (__s->pMethods != (sqlite3_io_methods *)0x0) {
                (*__s->pMethods->xClose)(__s);
                __s->pMethods = (sqlite3_io_methods *)0x0;
              }
              iVar7 = (*psVar1->xDelete)(psVar1,pcVar2,0);
              pcVar9 = local_70;
            }
          }
          else {
LAB_00138737:
            pcVar9 = (char *)0x0;
          }
          sqlite3_free(pcVar9);
LAB_00138742:
          if (__s->pMethods != (sqlite3_io_methods *)0x0) {
            (*__s->pMethods->xClose)(__s);
            __s->pMethods = (sqlite3_io_methods *)0x0;
          }
          sqlite3_free(__s);
          goto LAB_0013841e;
        }
      }
    }
  }
LAB_00138418:
  pPager->changeCountDone = pPager->tempFile;
LAB_0013841e:
  if ((isHot != 0) && (uVar13 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar13,pPager->zJournal);
  }
  setSectorSize(pPager);
  return iVar7;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zMaster = 0;       /* Name of master journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the master journal name from the journal, if it is present.
  ** If a master journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zMaster = pPager->pTmpSpace;
  rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zMaster[0] ){
    rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
  }
  zMaster = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or 
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error 
  ** occurs. 
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){ 
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages 
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
    }

    /* Copy original pages out of the journal and back into the 
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or 
  ** malloc error that occurred after the change-counter was updated but 
  ** before the transaction was committed, then the change-counter 
  ** modification may just have been reverted. If this happens in exclusive 
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    zMaster = pPager->pTmpSpace;
    rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zMaster[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zMaster[0] && res ){
    /* If there was a master journal and this routine will return success,
    ** see if it is possible to delete the master journal.
    */
    rc = pager_delmaster(pPager, zMaster);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}